

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O0

int __thiscall llvm::yaml::Scanner::init(Scanner *this,EVP_PKEY_CTX *ctx)

{
  SourceMgr *this_00;
  MemoryBufferRef Ref;
  int extraout_EAX;
  char *pcVar1;
  char *in_stack_00000008;
  size_t in_stack_00000010;
  char *in_stack_00000018;
  size_t in_stack_00000020;
  SMLoc local_48;
  unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_> local_40 [5];
  unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_> local_18;
  unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_> InputBufferOwner;
  Scanner *this_local;
  
  (this->InputBuffer).Buffer.Data = in_stack_00000008;
  (this->InputBuffer).Buffer.Length = in_stack_00000010;
  (this->InputBuffer).Identifier.Data = in_stack_00000018;
  (this->InputBuffer).Identifier.Length = in_stack_00000020;
  InputBufferOwner._M_t.
  super___uniq_ptr_impl<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>._M_t.
  super__Tuple_impl<0UL,_llvm::MemoryBuffer_*,_std::default_delete<llvm::MemoryBuffer>_>.
  super__Head_base<0UL,_llvm::MemoryBuffer_*,_false>._M_head_impl =
       (__uniq_ptr_data<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>,_true,_true>)
       (__uniq_ptr_data<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>,_true,_true>)
       this;
  pcVar1 = MemoryBufferRef::getBufferStart(&this->InputBuffer);
  this->Current = pcVar1;
  pcVar1 = MemoryBufferRef::getBufferEnd(&this->InputBuffer);
  this->End = pcVar1;
  this->Indent = -1;
  this->Column = 0;
  this->Line = 0;
  this->FlowLevel = 0;
  this->IsStartOfStream = true;
  this->IsSimpleKeyAllowed = true;
  this->Failed = false;
  Ref.Buffer.Length = in_stack_00000010;
  Ref.Buffer.Data = in_stack_00000008;
  Ref.Identifier.Data = in_stack_00000018;
  Ref.Identifier.Length = in_stack_00000020;
  MemoryBuffer::getMemBuffer(Ref,SUB81(&local_18,0));
  this_00 = this->SM;
  std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>::unique_ptr
            (local_40,&local_18);
  memset(&local_48,0,8);
  SMLoc::SMLoc(&local_48);
  SourceMgr::AddNewSourceBuffer(this_00,local_40,local_48);
  std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>::~unique_ptr
            (local_40);
  std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>::~unique_ptr
            (&local_18);
  return extraout_EAX;
}

Assistant:

void Scanner::init(MemoryBufferRef Buffer) {
  InputBuffer = Buffer;
  Current = InputBuffer.getBufferStart();
  End = InputBuffer.getBufferEnd();
  Indent = -1;
  Column = 0;
  Line = 0;
  FlowLevel = 0;
  IsStartOfStream = true;
  IsSimpleKeyAllowed = true;
  Failed = false;
  std::unique_ptr<MemoryBuffer> InputBufferOwner =
      MemoryBuffer::getMemBuffer(Buffer);
  SM.AddNewSourceBuffer(std::move(InputBufferOwner), SMLoc());
}